

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbitmap.cpp
# Opt level: O0

uint8_t VBitmap::Impl::depth(Format format)

{
  uint8_t depth;
  Format format_local;
  
  depth = '\x01';
  if (format == Alpha8) {
    depth = '\b';
  }
  else if ((byte)(format - ARGB32) < 2) {
    depth = ' ';
  }
  return depth;
}

Assistant:

uint8_t VBitmap::Impl::depth(VBitmap::Format format)
{
    uint8_t depth = 1;
    switch (format) {
    case VBitmap::Format::Alpha8:
        depth = 8;
        break;
    case VBitmap::Format::ARGB32:
    case VBitmap::Format::ARGB32_Premultiplied:
        depth = 32;
        break;
    default:
        break;
    }
    return depth;
}